

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  byte bVar1;
  uint uVar2;
  sqlite3_index_constraint *psVar3;
  sqlite3_index_constraint_usage *psVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined1 *puVar9;
  undefined *puVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  uint auStack_98 [3];
  int local_8c;
  int local_88 [4];
  undefined4 local_78;
  int aColMap [3];
  
  auStack_98[2] = *(uint *)&(pVTab[1].pModule)->xBestIndex;
  puVar9 = &DAT_001ccca0;
  piVar11 = local_88;
  for (lVar6 = 100; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined1 *)piVar11 = *puVar9;
    puVar9 = puVar9 + 1;
    piVar11 = (int *)((long)piVar11 + 1);
  }
  auStack_98[1] = 0xffffffff;
  local_8c = auStack_98[2] + 1;
  uVar12 = 0;
  uVar8 = (ulong)(uint)pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar8 = uVar12;
  }
  uVar14 = 0xffffffff;
  uVar15 = 0;
  do {
    if (uVar12 == uVar8) {
      local_78 = (int)uVar14;
      if (pInfo->nOrderBy == 1) {
        iVar7 = pInfo->aOrderBy->iColumn;
        uVar2 = uVar15 | 0x40;
        if (iVar7 != -1) {
          uVar2 = uVar15;
        }
        uVar5 = uVar15 | 0x20;
        if ((uVar15 & 1) == 0) {
          uVar5 = uVar2;
        }
        if (iVar7 != auStack_98[2] + 1) {
          uVar5 = uVar2;
        }
        uVar15 = uVar5;
        if ((uVar5 & 0x60) != 0) {
          pInfo->orderByConsumed = 1;
          if (pInfo->aOrderBy->desc != '\0') {
            uVar15 = uVar5 | 0x80;
          }
        }
      }
      if ((uVar15 & 4) == 0) {
        if ((uVar15 & 0x18) == 0) {
          uVar8 = (ulong)((uVar15 & 1) == 0);
          puVar10 = &DAT_001cf0a0;
        }
        else if ((uVar15 & 0x18) == 0x18) {
          uVar8 = (ulong)((uVar15 & 1) == 0);
          puVar10 = &DAT_001cf0b0;
        }
        else {
          uVar8 = (ulong)((uVar15 & 1) == 0);
          puVar10 = &DAT_001cf0c0;
        }
        pInfo->estimatedCost = *(double *)(puVar10 + uVar8 * 8);
      }
      else {
        bVar16 = (uVar15 & 1) == 0;
        pInfo->estimatedCost = *(double *)(&DAT_001cf090 + (ulong)bVar16 * 8);
        if (bVar16) {
          *(byte *)&pInfo->idxFlags = (byte)pInfo->idxFlags | 1;
        }
      }
      iVar7 = 1;
      for (lVar6 = 0x10; lVar6 != 0x74; lVar6 = lVar6 + 0x14) {
        lVar13 = (long)*(int *)((long)local_88 + lVar6);
        if (-1 < lVar13) {
          psVar4 = pInfo->aConstraintUsage;
          psVar4[lVar13].argvIndex = iVar7;
          iVar7 = iVar7 + 1;
          psVar4[lVar13].omit = *(uchar *)((long)local_88 + lVar6 + -4);
        }
      }
      pInfo->idxNum = uVar15;
      return 0;
    }
    psVar3 = pInfo->aConstraint;
    uVar2 = psVar3[uVar12].iColumn;
    bVar1 = psVar3[uVar12].op;
    if (((int)auStack_98[2] < (int)uVar2 || ((int)uVar2 < 0 || bVar1 != 0x40)) &&
       (uVar2 != auStack_98[2] || bVar1 != 2)) {
      if (bVar1 < 0x41) {
        for (lVar6 = 0x24; lVar6 != 0x74; lVar6 = lVar6 + 0x14) {
          if (((uVar2 == auStack_98[(long)*(int *)((long)auStack_98 + lVar6 + 8) + 1]) &&
              ((*(uint *)((long)auStack_98 + lVar6) & (uint)bVar1) != 0)) &&
             (psVar3[uVar12].usable != '\0')) {
            *(int *)((long)local_88 + lVar6) = (int)uVar12;
            uVar15 = uVar15 | *(uint *)((long)auStack_98 + lVar6 + 4);
          }
        }
      }
    }
    else {
      if (psVar3[uVar12].usable == '\0') {
        pInfo->estimatedCost = 1e+50;
        return 0;
      }
      uVar15 = uVar2 << 0x10 | uVar15 & 0xffff | 1;
      uVar14 = uVar12 & 0xffffffff;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static int fts5BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts5Table *pTab = (Fts5Table*)pVTab;
  Fts5Config *pConfig = pTab->pConfig;
  const int nCol = pConfig->nCol;
  int idxFlags = 0;               /* Parameter passed through to xFilter() */
  int bHasMatch;
  int iNext;
  int i;

  struct Constraint {
    int op;                       /* Mask against sqlite3_index_constraint.op */
    int fts5op;                   /* FTS5 mask for idxFlags */
    int iCol;                     /* 0==rowid, 1==tbl, 2==rank */
    int omit;                     /* True to omit this if found */
    int iConsIndex;               /* Index in pInfo->aConstraint[] */
  } aConstraint[] = {
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_MATCH,    1, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_RANK,     2, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_EQ,    FTS5_BI_ROWID_EQ, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_LT|SQLITE_INDEX_CONSTRAINT_LE, 
                                    FTS5_BI_ROWID_LE, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_GT|SQLITE_INDEX_CONSTRAINT_GE, 
                                    FTS5_BI_ROWID_GE, 0, 0, -1},
  };

  int aColMap[3];
  aColMap[0] = -1;
  aColMap[1] = nCol;
  aColMap[2] = nCol+1;

  assert( SQLITE_INDEX_CONSTRAINT_EQ<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GT<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );

  /* Set idxFlags flags for all WHERE clause terms that will be used. */
  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    int iCol = p->iColumn;

    if( (p->op==SQLITE_INDEX_CONSTRAINT_MATCH && iCol>=0 && iCol<=nCol)
     || (p->op==SQLITE_INDEX_CONSTRAINT_EQ && iCol==nCol)
    ){
      /* A MATCH operator or equivalent */
      if( p->usable ){
        idxFlags = (idxFlags & 0xFFFF) | FTS5_BI_MATCH | (iCol << 16);
        aConstraint[0].iConsIndex = i;
      }else{
        /* As there exists an unusable MATCH constraint this is an 
        ** unusable plan. Set a prohibitively high cost. */
        pInfo->estimatedCost = 1e50;
        return SQLITE_OK;
      }
    }else if( p->op<=SQLITE_INDEX_CONSTRAINT_MATCH ){
      int j;
      for(j=1; j<ArraySize(aConstraint); j++){
        struct Constraint *pC = &aConstraint[j];
        if( iCol==aColMap[pC->iCol] && (p->op & pC->op) && p->usable ){
          pC->iConsIndex = i;
          idxFlags |= pC->fts5op;
        }
      }
    }
  }

  /* Set idxFlags flags for the ORDER BY clause */
  if( pInfo->nOrderBy==1 ){
    int iSort = pInfo->aOrderBy[0].iColumn;
    if( iSort==(pConfig->nCol+1) && BitFlagTest(idxFlags, FTS5_BI_MATCH) ){
      idxFlags |= FTS5_BI_ORDER_RANK;
    }else if( iSort==-1 ){
      idxFlags |= FTS5_BI_ORDER_ROWID;
    }
    if( BitFlagTest(idxFlags, FTS5_BI_ORDER_RANK|FTS5_BI_ORDER_ROWID) ){
      pInfo->orderByConsumed = 1;
      if( pInfo->aOrderBy[0].desc ){
        idxFlags |= FTS5_BI_ORDER_DESC;
      }
    }
  }

  /* Calculate the estimated cost based on the flags set in idxFlags. */
  bHasMatch = BitFlagTest(idxFlags, FTS5_BI_MATCH);
  if( BitFlagTest(idxFlags, FTS5_BI_ROWID_EQ) ){
    pInfo->estimatedCost = bHasMatch ? 100.0 : 10.0;
    if( bHasMatch==0 ) fts5SetUniqueFlag(pInfo);
  }else if( BitFlagAllTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 500.0 : 250000.0;
  }else if( BitFlagTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 750.0 : 750000.0;
  }else{
    pInfo->estimatedCost = bHasMatch ? 1000.0 : 1000000.0;
  }

  /* Assign argvIndex values to each constraint in use. */
  iNext = 1;
  for(i=0; i<ArraySize(aConstraint); i++){
    struct Constraint *pC = &aConstraint[i];
    if( pC->iConsIndex>=0 ){
      pInfo->aConstraintUsage[pC->iConsIndex].argvIndex = iNext++;
      pInfo->aConstraintUsage[pC->iConsIndex].omit = (unsigned char)pC->omit;
    }
  }

  pInfo->idxNum = idxFlags;
  return SQLITE_OK;
}